

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  undefined1 auVar8 [32];
  __m256i alVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  short sVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  parasail_result_t *ppVar18;
  __m256i *ptr;
  int16_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *palVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  int16_t iVar25;
  int iVar26;
  undefined4 uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  ulong size;
  long lVar33;
  undefined2 uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  __m256i_16_t e;
  __m256i_16_t h;
  int local_1dc;
  long local_150;
  int local_140;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar36 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_avx2_256_16_cold_6();
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          parasail_sg_flags_table_scan_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_avx2_256_16_cold_4();
        }
        else {
          uVar24 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_scan_profile_avx2_256_16_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_scan_profile_avx2_256_16_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_scan_profile_avx2_256_16_cold_1();
          }
          else {
            iVar14 = uVar4 - 1;
            uVar1 = (ulong)uVar4 + 0xf;
            size = uVar1 >> 4;
            uVar31 = (uint)size;
            iVar15 = iVar14 / (int)uVar31;
            iVar20 = -open;
            iVar16 = ppVar6->min;
            iVar26 = -iVar16;
            if (iVar16 != iVar20 && SBORROW4(iVar16,iVar20) == iVar16 + open < 0) {
              iVar26 = open;
            }
            sVar13 = 0x7ffe - (short)ppVar6->max;
            ppVar18 = parasail_result_new_table1((uint)uVar1 & 0x7ffffff0,s2Len);
            if (ppVar18 != (parasail_result_t *)0x0) {
              ppVar18->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x10220402;
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign_int16_t(0x20,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              if (ptr_03 != (__m256i *)0x0 &&
                  ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                  (ptr_00 != (int16_t *)0x0 && ptr != (__m256i *)0x0))) {
                iVar16 = s2Len + -1;
                iVar17 = 0xf - iVar15;
                uVar34 = (undefined2)open;
                auVar40._2_2_ = uVar34;
                auVar40._0_2_ = uVar34;
                auVar40._4_2_ = uVar34;
                auVar40._6_2_ = uVar34;
                auVar40._8_2_ = uVar34;
                auVar40._10_2_ = uVar34;
                auVar40._12_2_ = uVar34;
                auVar40._14_2_ = uVar34;
                auVar40._16_2_ = uVar34;
                auVar40._18_2_ = uVar34;
                auVar40._20_2_ = uVar34;
                auVar40._22_2_ = uVar34;
                auVar40._24_2_ = uVar34;
                auVar40._26_2_ = uVar34;
                auVar40._28_2_ = uVar34;
                auVar40._30_2_ = uVar34;
                uVar34 = (undefined2)gap;
                auVar41._2_2_ = uVar34;
                auVar41._0_2_ = uVar34;
                auVar41._4_2_ = uVar34;
                auVar41._6_2_ = uVar34;
                auVar41._8_2_ = uVar34;
                auVar41._10_2_ = uVar34;
                auVar41._12_2_ = uVar34;
                auVar41._14_2_ = uVar34;
                auVar41._16_2_ = uVar34;
                auVar41._18_2_ = uVar34;
                auVar41._20_2_ = uVar34;
                auVar41._22_2_ = uVar34;
                auVar41._24_2_ = uVar34;
                auVar41._26_2_ = uVar34;
                auVar41._28_2_ = uVar34;
                auVar41._30_2_ = uVar34;
                uVar32 = iVar26 - 0x7fff;
                auVar35._0_2_ = (undefined2)uVar32;
                auVar35._2_2_ = auVar35._0_2_;
                auVar35._4_2_ = auVar35._0_2_;
                auVar35._6_2_ = auVar35._0_2_;
                auVar35._8_2_ = auVar35._0_2_;
                auVar35._10_2_ = auVar35._0_2_;
                auVar35._12_2_ = auVar35._0_2_;
                auVar35._14_2_ = auVar35._0_2_;
                auVar36._16_2_ = auVar35._0_2_;
                auVar36._0_16_ = auVar35;
                auVar36._18_2_ = auVar35._0_2_;
                auVar36._20_2_ = auVar35._0_2_;
                auVar36._22_2_ = auVar35._0_2_;
                auVar36._24_2_ = auVar35._0_2_;
                auVar36._26_2_ = auVar35._0_2_;
                auVar36._28_2_ = auVar35._0_2_;
                auVar36._30_2_ = auVar35._0_2_;
                auVar37._2_2_ = sVar13;
                auVar37._0_2_ = sVar13;
                auVar37._4_2_ = sVar13;
                auVar37._6_2_ = sVar13;
                auVar37._8_2_ = sVar13;
                auVar37._10_2_ = sVar13;
                auVar37._12_2_ = sVar13;
                auVar37._14_2_ = sVar13;
                auVar37._16_2_ = sVar13;
                auVar37._18_2_ = sVar13;
                auVar37._20_2_ = sVar13;
                auVar37._22_2_ = sVar13;
                auVar37._24_2_ = sVar13;
                auVar37._26_2_ = sVar13;
                auVar37._28_2_ = sVar13;
                auVar37._30_2_ = sVar13;
                uVar34 = (undefined2)iVar17;
                auVar42._2_2_ = uVar34;
                auVar42._0_2_ = uVar34;
                auVar42._4_2_ = uVar34;
                auVar42._6_2_ = uVar34;
                auVar42._8_2_ = uVar34;
                auVar42._10_2_ = uVar34;
                auVar42._12_2_ = uVar34;
                auVar42._14_2_ = uVar34;
                auVar42._16_2_ = uVar34;
                auVar42._18_2_ = uVar34;
                auVar42._20_2_ = uVar34;
                auVar42._22_2_ = uVar34;
                auVar42._24_2_ = uVar34;
                auVar42._26_2_ = uVar34;
                auVar42._28_2_ = uVar34;
                auVar42._30_2_ = uVar34;
                auVar38._0_2_ = (undefined2)-(uVar31 * gap);
                auVar38._2_2_ = auVar38._0_2_;
                auVar38._4_2_ = auVar38._0_2_;
                auVar38._6_2_ = auVar38._0_2_;
                auVar38._8_2_ = auVar38._0_2_;
                auVar38._10_2_ = auVar38._0_2_;
                auVar38._12_2_ = auVar38._0_2_;
                auVar38._14_2_ = auVar38._0_2_;
                auVar38._16_2_ = auVar38._0_2_;
                auVar38._18_2_ = auVar38._0_2_;
                auVar38._20_2_ = auVar38._0_2_;
                auVar38._22_2_ = auVar38._0_2_;
                auVar38._24_2_ = auVar38._0_2_;
                auVar38._26_2_ = auVar38._0_2_;
                auVar38._28_2_ = auVar38._0_2_;
                auVar38._30_2_ = auVar38._0_2_;
                auVar38 = vpand_avx2(auVar38,_DAT_008d4840);
                auVar38 = vpaddsw_avx2(ZEXT432(uVar32 & 0xffff),auVar38);
                lVar22 = (long)iVar20;
                uVar28 = 0;
                do {
                  lVar30 = 0;
                  lVar29 = lVar22;
                  do {
                    lVar33 = lVar29;
                    if (s1_beg != 0) {
                      lVar33 = 0;
                    }
                    uVar34 = 0x8000;
                    if (-0x8000 < lVar33) {
                      uVar34 = (undefined2)lVar33;
                    }
                    *(undefined2 *)((long)&local_80 + lVar30 * 2) = uVar34;
                    lVar33 = lVar33 - (ulong)(uint)open;
                    if (lVar33 < -0x7fff) {
                      lVar33 = -0x8000;
                    }
                    *(short *)((long)&local_a0 + lVar30 * 2) = (short)lVar33;
                    lVar30 = lVar30 + 1;
                    lVar29 = lVar29 - size * (uint)gap;
                  } while (lVar30 != 0x10);
                  palVar19 = ptr_02 + uVar28;
                  (*palVar19)[0] = local_80;
                  (*palVar19)[1] = lStack_78;
                  (*palVar19)[2] = lStack_70;
                  (*palVar19)[3] = lStack_68;
                  palVar19 = ptr + uVar28;
                  (*palVar19)[0] = local_a0;
                  (*palVar19)[1] = lStack_98;
                  (*palVar19)[2] = lStack_90;
                  (*palVar19)[3] = lStack_88;
                  uVar28 = uVar28 + 1;
                  lVar22 = lVar22 - (ulong)(uint)gap;
                } while (uVar28 != size);
                *ptr_00 = 0;
                uVar28 = 1;
                if (1 < s2Len) {
                  uVar28 = uVar24;
                }
                uVar23 = 0;
                do {
                  iVar25 = -0x8000;
                  if (-0x8000 < iVar20) {
                    iVar25 = (int16_t)iVar20;
                  }
                  if (s2_beg != 0) {
                    iVar25 = 0;
                  }
                  ptr_00[uVar23 + 1] = iVar25;
                  iVar20 = iVar20 - gap;
                  uVar23 = uVar23 + 1;
                } while (uVar28 != uVar23);
                alVar9 = (__m256i)vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar40);
                palVar19 = ptr_03 + (uVar31 - 1);
                auVar39 = ZEXT3264(auVar37);
                uVar28 = size;
                do {
                  *palVar19 = alVar9;
                  alVar9 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar9,auVar41);
                  auVar46 = vpminsw_avx2((undefined1  [32])alVar9,auVar39._0_32_);
                  auVar39 = ZEXT3264(auVar46);
                  palVar19 = palVar19 + -1;
                  iVar26 = (int)uVar28;
                  uVar21 = iVar26 - 1;
                  uVar28 = (ulong)uVar21;
                } while (uVar21 != 0 && 0 < iVar26);
                uVar28 = 1;
                if (1 < s2Len) {
                  uVar28 = uVar24;
                }
                lVar29 = (ulong)(uVar31 + (uVar31 == 0)) << 5;
                lVar22 = size * uVar24;
                auVar42 = vpcmpeqw_avx2(auVar42,_DAT_008d4860);
                auVar44 = ZEXT3264(auVar36);
                auVar43 = ZEXT3264(auVar36);
                local_150 = 0;
                uVar23 = 0;
                local_1dc = iVar16;
                do {
                  iVar26 = ppVar6->mapper[(byte)s2[uVar23]];
                  auVar10 = vpsubsw_avx2(auVar36,(undefined1  [32])*ptr_03);
                  auVar45 = SUB3216(ptr_02[uVar31 - 1],0);
                  auVar46._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar35;
                  auVar46._16_16_ = ZEXT116(0) * auVar36._16_16_ + ZEXT116(1) * auVar45;
                  auVar46 = vpalignr_avx2((undefined1  [32])ptr_02[uVar31 - 1],auVar46,0xe);
                  auVar45 = vpinsrw_avx(auVar46._0_16_,(uint)(ushort)ptr_00[uVar23],0);
                  auVar46 = vpblendd_avx2(auVar46,ZEXT1632(auVar45),0xf);
                  lVar30 = 0;
                  auVar8 = auVar36;
                  do {
                    auVar47 = vpaddsw_avx2(auVar46,*(undefined1 (*) [32])
                                                    ((long)pvVar5 +
                                                    lVar30 + size * (long)iVar26 * 0x20));
                    auVar46 = *(undefined1 (*) [32])((long)*ptr_02 + lVar30);
                    auVar11 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*ptr + lVar30),auVar41);
                    auVar12 = vpsubsw_avx2(auVar46,auVar40);
                    auVar11 = vpmaxsw_avx2(auVar11,auVar12);
                    auVar10 = vpaddsw_avx2(auVar10,*(undefined1 (*) [32])((long)*ptr_03 + lVar30));
                    auVar8 = vpmaxsw_avx2(auVar8,auVar10);
                    auVar10 = vpmaxsw_avx2(auVar11,auVar47);
                    *(undefined1 (*) [32])((long)*ptr + lVar30) = auVar11;
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar30) = auVar10;
                    lVar30 = lVar30 + 0x20;
                  } while (lVar29 != lVar30);
                  auVar47._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar35;
                  auVar47._16_16_ = ZEXT116(0) * auVar36._16_16_ + ZEXT116(1) * auVar10._0_16_;
                  auVar46 = vpalignr_avx2(auVar10,auVar47,0xe);
                  uVar2 = uVar23 + 1;
                  auVar45 = vpinsrw_avx(auVar46._0_16_,(uint)(ushort)ptr_00[uVar23 + 1],0);
                  auVar10 = vpblendd_avx2(auVar46,ZEXT1632(auVar45),0xf);
                  auVar46 = vpaddsw_avx2(auVar10,(undefined1  [32])*ptr_03);
                  auVar46 = vpmaxsw_avx2(auVar8,auVar46);
                  iVar26 = 0xe;
                  do {
                    auVar8 = vperm2i128_avx2(auVar46,auVar46,0x28);
                    auVar8 = vpalignr_avx2(auVar46,auVar8,0xe);
                    auVar8 = vpaddsw_avx2(auVar8,auVar38);
                    auVar46 = vpmaxsw_avx2(auVar46,auVar8);
                    iVar26 = iVar26 + -1;
                  } while (iVar26 != 0);
                  auVar8 = vperm2i128_avx2(auVar46,auVar46,0x28);
                  auVar46 = vpalignr_avx2(auVar46,auVar8,0xe);
                  auVar46 = vpaddsw_avx2(auVar46,ZEXT432(uVar32 & 0xffff));
                  auVar8 = vpmaxsw_avx2(auVar10,auVar46);
                  lVar33 = 0;
                  lVar30 = local_150;
                  do {
                    auVar46 = vpsubsw_avx2(auVar46,auVar41);
                    auVar8 = vpsubsw_avx2(auVar8,auVar40);
                    auVar46 = vpmaxsw_avx2(auVar46,auVar8);
                    auVar8 = vpmaxsw_avx2(auVar46,*(undefined1 (*) [32])((long)*ptr_01 + lVar33));
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar33) = auVar8;
                    piVar7 = ((ppVar18->field_4).rowcols)->score_row;
                    *(int *)((long)piVar7 + lVar30) = (int)auVar8._0_2_;
                    auVar45 = auVar8._0_16_;
                    uVar27 = vpextrw_avx(auVar45,1);
                    *(int *)((long)piVar7 + lVar22 * 4 + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,2);
                    *(int *)((long)piVar7 + lVar22 * 8 + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,3);
                    *(int *)((long)piVar7 + lVar22 * 0xc + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,4);
                    *(int *)((long)piVar7 + lVar22 * 0x10 + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,5);
                    *(int *)((long)piVar7 + lVar22 * 0x14 + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,6);
                    *(int *)((long)piVar7 + lVar22 * 0x18 + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,7);
                    *(int *)((long)piVar7 + lVar22 * 0x1c + lVar30) = (int)(short)uVar27;
                    auVar45 = auVar8._16_16_;
                    *(int *)((long)piVar7 + lVar22 * 0x20 + lVar30) = (int)auVar8._16_2_;
                    uVar27 = vpextrw_avx(auVar45,1);
                    *(int *)((long)piVar7 + lVar22 * 0x24 + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,2);
                    *(int *)((long)piVar7 + lVar22 * 0x28 + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,3);
                    *(int *)((long)piVar7 + lVar22 * 0x2c + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,4);
                    *(int *)((long)piVar7 + lVar22 * 0x30 + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,5);
                    *(int *)((long)piVar7 + lVar22 * 0x34 + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,6);
                    *(int *)((long)piVar7 + lVar22 * 0x38 + lVar30) = (int)(short)uVar27;
                    uVar27 = vpextrw_avx(auVar45,7);
                    *(int *)((long)piVar7 + lVar22 * 0x3c + lVar30) = (int)(short)uVar27;
                    auVar10 = vpminsw_avx2(auVar46,auVar39._0_32_);
                    auVar47 = vpminsw_avx2(auVar8,auVar10);
                    auVar39 = ZEXT3264(auVar47);
                    auVar10 = vpmaxsw_avx2(auVar8,auVar43._0_32_);
                    auVar43 = ZEXT3264(auVar10);
                    lVar33 = lVar33 + 0x20;
                    lVar30 = lVar30 + uVar24 * 4;
                  } while (lVar29 != lVar33);
                  auVar46 = vpcmpgtw_avx2((undefined1  [32])ptr_02[(uint)(iVar14 % (int)uVar31)],
                                          auVar44._0_32_);
                  auVar46 = vpand_avx2(auVar46,auVar42);
                  auVar8 = vpmaxsw_avx2((undefined1  [32])ptr_02[(uint)(iVar14 % (int)uVar31)],
                                        auVar44._0_32_);
                  auVar45 = auVar8._16_16_;
                  auVar44 = ZEXT3264(auVar8);
                  local_140 = (int)uVar23;
                  if ((((((((((((((((((((((((((((((((auVar46 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar46 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar46 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar46 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar46 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar46 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar46 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar46 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar46 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar46 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar46 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar46 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar46 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar46 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar46 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar46 >> 0x7f,0) != '\0')
                                    || (auVar46 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar46 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar46 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar46 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar46 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar46 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar46 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar46 >> 0xbf,0) != '\0') ||
                            (auVar46 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar46 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar46 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar46 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar46 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar46 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar46 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar46[0x1f] < '\0') {
                    local_1dc = local_140;
                  }
                  local_150 = local_150 + 4;
                  uVar23 = uVar2;
                } while (uVar2 != uVar28);
                if (s2_end != 0) {
                  if (iVar15 < 0xf) {
                    iVar26 = 1;
                    if (1 < iVar17) {
                      iVar26 = iVar17;
                    }
                    do {
                      auVar40 = auVar44._0_32_;
                      auVar38 = vperm2i128_avx2(auVar40,auVar40,0x28);
                      auVar38 = vpalignr_avx2(auVar40,auVar38,0xe);
                      auVar45 = auVar38._16_16_;
                      auVar44 = ZEXT3264(auVar38);
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  uVar32 = vpextrw_avx(auVar45,7);
                }
                sVar13 = (short)uVar32;
                iVar26 = iVar14;
                if ((s1_end != 0) && ((uVar1 & 0x7ffffff0) != 0)) {
                  uVar24 = 0;
                  do {
                    iVar20 = ((uint)uVar24 & 0xf) * uVar31 + ((uint)(uVar24 >> 4) & 0xfffffff);
                    if (iVar20 < (int)uVar4) {
                      uVar3 = *(ushort *)((long)*ptr_02 + uVar24 * 2);
                      if ((short)(ushort)uVar32 < (short)uVar3) {
                        uVar32 = (uint)uVar3;
                        local_1dc = iVar16;
                        iVar26 = iVar20;
                      }
                      else {
                        if (iVar26 <= iVar20) {
                          iVar20 = iVar26;
                        }
                        if (local_1dc != iVar16) {
                          iVar20 = iVar26;
                        }
                        if (uVar3 == (ushort)uVar32) {
                          iVar26 = iVar20;
                        }
                      }
                    }
                    sVar13 = (short)uVar32;
                    uVar24 = uVar24 + 1;
                  } while ((uVar31 & 0x7ffffff) << 4 != (int)uVar24);
                }
                if (s2_end == 0 && s1_end == 0) {
                  auVar35 = SUB3216(ptr_02[(uint)(iVar14 % (int)uVar31)],0x10);
                  auVar39 = ZEXT3264((undefined1  [32])ptr_02[(uint)(iVar14 % (int)uVar31)]);
                  if (iVar15 < 0xf) {
                    iVar26 = 1;
                    if (1 < iVar17) {
                      iVar26 = iVar17;
                    }
                    do {
                      auVar40 = auVar39._0_32_;
                      auVar38 = vperm2i128_avx2(auVar40,auVar40,0x28);
                      auVar38 = vpalignr_avx2(auVar40,auVar38,0xe);
                      auVar35 = auVar38._16_16_;
                      auVar39 = ZEXT3264(auVar38);
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  uVar27 = vpextrw_avx(auVar35,7);
                  sVar13 = (short)uVar27;
                  local_1dc = iVar16;
                  iVar26 = iVar14;
                }
                auVar38 = vpcmpgtw_avx2(auVar36,auVar47);
                auVar36 = vpcmpgtw_avx2(auVar10,auVar37);
                auVar38 = vpor_avx2(auVar36,auVar38);
                if ((((((((((((((((((((((((((((((((auVar38 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar38 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar38 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar38 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar38 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar38 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar38 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar38 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar38 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar38 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar38 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar38 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar38 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar38 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar38 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar38 >> 0x7f,0) != '\0') ||
                                  (auVar38 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar38 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar38 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar38 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar38 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar38 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar38 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar38 >> 0xbf,0) != '\0') ||
                          (auVar38 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar38 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar38 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar38 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar38 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar38 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar38 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar38[0x1f] < '\0') {
                  *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                  sVar13 = 0;
                  local_1dc = 0;
                  iVar26 = 0;
                }
                ppVar18->score = (int)sVar13;
                ppVar18->end_query = iVar26;
                ppVar18->end_ref = local_1dc;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar18;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi16(_mm256_set1_epi16(position),
            _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            __m256i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vE, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vHp = _mm256_adds_epi16(vHp, vW);
            vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm256_max_epi16(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            vF = _mm256_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        vH = _mm256_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vF, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vH = _mm256_max_epi16(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm256_max_epi16(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}